

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68000_bra_8(m68k_info *info)

{
  long in_RDI;
  m68k_info *unaff_retaddr;
  long lVar1;
  
  lVar1 = in_RDI;
  make_int_8(*(int *)(in_RDI + 0x24));
  build_relative_branch
            (unaff_retaddr,(int)((ulong)lVar1 >> 0x20),(int)lVar1,(int)((ulong)in_RDI >> 0x20));
  return;
}

Assistant:

static void d68000_bra_8(m68k_info *info)
{
	build_relative_branch(info, M68K_INS_BRA, 1, make_int_8(info->ir));
}